

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv__udp_try_send(uv_udp_t *handle,uv_buf_t *bufs,uint nbufs,sockaddr *addr,uint addrlen)

{
  ssize_t sVar1;
  int *piVar2;
  bool bVar3;
  ssize_t size;
  msghdr h;
  int err;
  uint addrlen_local;
  sockaddr *addr_local;
  uint nbufs_local;
  uv_buf_t *bufs_local;
  uv_udp_t *handle_local;
  
  h._52_4_ = addrlen;
  if (nbufs != 0) {
    if (handle->send_queue_count == 0) {
      h.msg_flags = uv__udp_maybe_deferred_bind(handle,(uint)addr->sa_family,0);
      handle_local._4_4_ = h.msg_flags;
      if (h.msg_flags == 0) {
        memset(&size,0,0x38);
        h.msg_name._0_4_ = h._52_4_;
        h.msg_iov = (iovec *)(ulong)nbufs;
        size = (ssize_t)addr;
        h._8_8_ = bufs;
        do {
          sVar1 = sendmsg((handle->io_watcher).fd,(msghdr *)&size,0);
          bVar3 = false;
          if (sVar1 == -1) {
            piVar2 = __errno_location();
            bVar3 = *piVar2 == 4;
          }
        } while (bVar3);
        if (sVar1 == -1) {
          piVar2 = __errno_location();
          if ((*piVar2 == 0xb) || (piVar2 = __errno_location(), *piVar2 == 0xb)) {
            handle_local._4_4_ = -0xb;
          }
          else {
            piVar2 = __errno_location();
            handle_local._4_4_ = -*piVar2;
          }
        }
        else {
          handle_local._4_4_ = (int)sVar1;
        }
      }
    }
    else {
      handle_local._4_4_ = -0xb;
    }
    return handle_local._4_4_;
  }
  __assert_fail("nbufs > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                ,0x1c6,
                "int uv__udp_try_send(uv_udp_t *, const uv_buf_t *, unsigned int, const struct sockaddr *, unsigned int)"
               );
}

Assistant:

int uv__udp_try_send(uv_udp_t* handle,
                     const uv_buf_t bufs[],
                     unsigned int nbufs,
                     const struct sockaddr* addr,
                     unsigned int addrlen) {
  int err;
  struct msghdr h;
  ssize_t size;

  assert(nbufs > 0);

  /* already sending a message */
  if (handle->send_queue_count != 0)
    return -EAGAIN;

  err = uv__udp_maybe_deferred_bind(handle, addr->sa_family, 0);
  if (err)
    return err;

  memset(&h, 0, sizeof h);
  h.msg_name = (struct sockaddr*) addr;
  h.msg_namelen = addrlen;
  h.msg_iov = (struct iovec*) bufs;
  h.msg_iovlen = nbufs;

  do {
    size = sendmsg(handle->io_watcher.fd, &h, 0);
  } while (size == -1 && errno == EINTR);

  if (size == -1) {
    if (errno == EAGAIN || errno == EWOULDBLOCK)
      return -EAGAIN;
    else
      return -errno;
  }

  return size;
}